

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O0

ssize_t __thiscall
kj::BufferedOutputStreamWrapper::write
          (BufferedOutputStreamWrapper *this,int __fd,void *__buf,size_t __n)

{
  OutputStream *pOVar1;
  byte *pbVar2;
  int iVar3;
  uchar *puVar4;
  void *pvVar5;
  uchar *puVar6;
  size_t sVar7;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  byte *__src;
  size_t available;
  size_t size_local;
  void *src_local;
  BufferedOutputStreamWrapper *this_local;
  
  __src = (byte *)CONCAT44(in_register_00000034,__fd);
  if (__src == this->bufferPos) {
    this->bufferPos = (byte *)((long)__buf + (long)this->bufferPos);
  }
  else {
    puVar4 = ArrayPtr<unsigned_char>::end(&this->buffer);
    puVar4 = puVar4 + -(long)this->bufferPos;
    if (puVar4 < __buf) {
      pvVar5 = (void *)ArrayPtr<unsigned_char>::size(&this->buffer);
      if (pvVar5 < __buf) {
        pOVar1 = this->inner;
        puVar4 = ArrayPtr<unsigned_char>::begin(&this->buffer);
        pbVar2 = this->bufferPos;
        puVar6 = ArrayPtr<unsigned_char>::begin(&this->buffer);
        (*pOVar1->_vptr_OutputStream[2])(pOVar1,puVar4,(long)pbVar2 - (long)puVar6);
        puVar4 = ArrayPtr<unsigned_char>::begin(&this->buffer);
        this->bufferPos = puVar4;
        iVar3 = (*this->inner->_vptr_OutputStream[2])(this->inner,__src,__buf);
        this = (BufferedOutputStreamWrapper *)CONCAT44(extraout_var,iVar3);
      }
      else {
        memcpy(this->bufferPos,__src,(size_t)puVar4);
        pOVar1 = this->inner;
        puVar6 = ArrayPtr<unsigned_char>::begin(&this->buffer);
        sVar7 = ArrayPtr<unsigned_char>::size(&this->buffer);
        (*pOVar1->_vptr_OutputStream[2])(pOVar1,puVar6,sVar7);
        puVar6 = ArrayPtr<unsigned_char>::begin(&this->buffer);
        memcpy(puVar6,__src + (long)puVar4,(long)__buf - (long)puVar4);
        puVar6 = ArrayPtr<unsigned_char>::begin(&this->buffer);
        this->bufferPos = puVar6 + ((long)__buf - (long)puVar4);
      }
    }
    else {
      memcpy(this->bufferPos,__src,(size_t)__buf);
      this->bufferPos = (byte *)((long)__buf + (long)this->bufferPos);
    }
  }
  return (ssize_t)this;
}

Assistant:

void BufferedOutputStreamWrapper::write(const void* src, size_t size) {
  if (src == bufferPos) {
    // Oh goody, the caller wrote directly into our buffer.
    bufferPos += size;
  } else {
    size_t available = buffer.end() - bufferPos;

    if (size <= available) {
      memcpy(bufferPos, src, size);
      bufferPos += size;
    } else if (size <= buffer.size()) {
      // Too much for this buffer, but not a full buffer's worth, so we'll go ahead and copy.
      memcpy(bufferPos, src, available);
      inner.write(buffer.begin(), buffer.size());

      size -= available;
      src = reinterpret_cast<const byte*>(src) + available;

      memcpy(buffer.begin(), src, size);
      bufferPos = buffer.begin() + size;
    } else {
      // Writing so much data that we might as well write directly to avoid a copy.
      inner.write(buffer.begin(), bufferPos - buffer.begin());
      bufferPos = buffer.begin();
      inner.write(src, size);
    }
  }
}